

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O2

void __thiscall
xray_re::xr_writer::
w_seq<std::vector<xray_re::way_link,std::allocator<xray_re::way_link>>,xray_re::way_link_io>
          (xr_writer *this,undefined8 *container)

{
  way_link *pwVar1;
  way_link *link;
  way_link_io local_21;
  
  pwVar1 = (way_link *)container[1];
  for (link = (way_link *)*container; link != pwVar1; link = link + 1) {
    way_link_io::operator()(&local_21,link,this);
  }
  return;
}

Assistant:

inline void xr_writer::w_seq(const T& container, F write)
{
	for (typename T::const_iterator it = container.begin(),
			end = container.end(); it != end; ++it) {
		write(*it, *this);
	}
}